

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOCC-OTA-cs16btech11038.cpp
# Opt level: O2

ssize_t __thiscall FOCC_OTA::read(FOCC_OTA *this,int __fd,void *__buf,size_t __nbytes)

{
  set<Transaction_*,_TransCompare,_std::allocator<Transaction_*>_> *this_00;
  Transaction *this_01;
  DataItem *pDVar1;
  char cVar2;
  mapped_type *ppTVar3;
  int __fd_00;
  ulong uVar4;
  pair<std::_Rb_tree_iterator<Transaction_*>,_bool> pVar5;
  Transaction *cur;
  int *local_40;
  int tid_local;
  
  local_40 = (int *)__nbytes;
  tid_local = __fd;
  std::__shared_mutex_pthread::lock_shared(&(this->scheduler_lock)._M_impl);
  __fd_00 = (int)__buf;
  std::mutex::lock(&(this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[__fd_00]->lock);
  ppTVar3 = std::
            map<int,_Transaction_*,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
            ::operator[](&this->transactions,&tid_local);
  this_01 = *ppTVar3;
  cur = this_01;
  std::mutex::lock(&this_01->t_status_mtx);
  cVar2 = Transaction::getStatus(this_01);
  pDVar1 = (this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>._M_impl.
           super__Vector_impl_data._M_start[__fd_00];
  this_00 = &pDVar1->read_list;
  if (cVar2 == 'a') {
    std::
    _Rb_tree<Transaction_*,_Transaction_*,_std::_Identity<Transaction_*>,_TransCompare,_std::allocator<Transaction_*>_>
    ::erase(&this_00->_M_t,&cur);
    uVar4 = 0xfffffffffffffffe;
  }
  else {
    pVar5 = std::
            _Rb_tree<Transaction*,Transaction*,std::_Identity<Transaction*>,TransCompare,std::allocator<Transaction*>>
            ::_M_insert_unique<Transaction*const&>
                      ((_Rb_tree<Transaction*,Transaction*,std::_Identity<Transaction*>,TransCompare,std::allocator<Transaction*>>
                        *)this_00,&cur);
    *local_40 = pDVar1->value;
    Transaction::read(cur,__fd_00,pVar5._8_8_,(size_t)local_40);
    uVar4 = 0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&cur->t_status_mtx);
  pthread_mutex_unlock
            ((pthread_mutex_t *)
             &(this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>._M_impl.
              super__Vector_impl_data._M_start[__fd_00]->lock);
  pthread_rwlock_unlock((pthread_rwlock_t *)&this->scheduler_lock);
  return uVar4 & 0xffffffff;
}

Assistant:

int FOCC_OTA::read(int tid, int dIdx, int *store) {
    scheduler_lock.lock_shared();
    dataItems[dIdx]->lock.lock();

    Transaction *cur = transactions[tid];
    cur->t_status_mtx.lock();

    if(cur->getStatus()=='a'){

        // remove this transaction from the read list of this data item.
        dataItems[dIdx]->read_list.erase(cur);

        cur->t_status_mtx.unlock();
        dataItems[dIdx]->lock.unlock();
        scheduler_lock.unlock_shared();

        return -2;
    }

    DataItem* curItem = dataItems[dIdx];
    curItem->read_list.insert(cur);
    *store = curItem->value;
    // This function just adds dIdx to the readSet!
    cur->read(dIdx);

    cur->t_status_mtx.unlock();
    dataItems[dIdx]->lock.unlock();
    scheduler_lock.unlock_shared();

    return 0;
}